

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaItemListGrow(xmlSchemaItemListPtr list,int initialSize)

{
  uint uVar1;
  void **ppvVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  uVar5 = 1;
  if (1 < initialSize) {
    uVar5 = initialSize;
  }
  uVar1 = list->sizeItems;
  iVar3 = -1;
  if (0 < (int)uVar1) {
    if (999999999 < uVar1) {
      return -1;
    }
    uVar4 = uVar1 + 1 >> 1;
    uVar5 = uVar4 + uVar1;
    if (1000000000 - uVar4 < uVar1) {
      uVar5 = 1000000000;
    }
  }
  ppvVar2 = (void **)(*xmlRealloc)(list->items,(ulong)uVar5 << 3);
  if (ppvVar2 != (void **)0x0) {
    list->items = ppvVar2;
    list->sizeItems = uVar5;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int
xmlSchemaItemListGrow(xmlSchemaItemListPtr list, int initialSize)
{
    void **tmp;
    int newSize;

    if (initialSize <= 0)
        initialSize = 1;
    newSize = xmlGrowCapacity(list->sizeItems, sizeof(tmp[0]),
                              initialSize, XML_MAX_ITEMS);
    if (newSize < 0)
        return(-1);
    tmp = xmlRealloc(list->items, newSize * sizeof(tmp[0]));
    if (tmp == NULL)
        return(-1);

    list->items = tmp;
    list->sizeItems = newSize;
    return(0);
}